

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O0

void anon_unknown.dwarf_16af90::fillPixels<unsigned_int>
               (Array2D<unsigned_int> *sampleCount,Array2D<unsigned_int_*> *ph,int width,int height)

{
  int iVar1;
  uint *puVar2;
  ulong uVar3;
  uint **ppuVar4;
  int in_ECX;
  int in_EDX;
  Array2D<unsigned_int_*> *in_RSI;
  Array2D<unsigned_int> *in_RDI;
  uint i;
  int x;
  int y;
  uint local_24;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar6;
  
  Imf_3_2::Array2D<unsigned_int_*>::resizeErase
            (in_RSI,CONCAT44(in_EDX,in_ECX),
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  for (iVar6 = 0; iVar6 < in_ECX; iVar6 = iVar6 + 1) {
    for (iVar5 = 0; iVar5 < in_EDX; iVar5 = iVar5 + 1) {
      puVar2 = Imf_3_2::Array2D<unsigned_int>::operator[](in_RDI,(long)iVar6);
      uVar3 = SUB168(ZEXT416(puVar2[iVar5]) * ZEXT816(4),0);
      if (SUB168(ZEXT416(puVar2[iVar5]) * ZEXT816(4),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      puVar2 = (uint *)operator_new__(uVar3);
      ppuVar4 = Imf_3_2::Array2D<unsigned_int_*>::operator[](in_RSI,(long)iVar6);
      ppuVar4[iVar5] = puVar2;
      local_24 = 0;
      while( true ) {
        puVar2 = Imf_3_2::Array2D<unsigned_int>::operator[](in_RDI,(long)iVar6);
        if (puVar2[iVar5] <= local_24) break;
        iVar1 = iVar6 * in_EDX + iVar5;
        ppuVar4 = Imf_3_2::Array2D<unsigned_int_*>::operator[](in_RSI,(long)iVar6);
        ppuVar4[iVar5][local_24] = iVar1 % 0x801;
        local_24 = local_24 + 1;
      }
    }
  }
  return;
}

Assistant:

void
fillPixels (
    Array2D<unsigned int>& sampleCount, Array2D<T*>& ph, int width, int height)
{
    ph.resizeErase (height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            ph[y][x] = new T[sampleCount[y][x]];
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                //
                // We do this because half cannot store number bigger than 2048 exactly.
                //
                ph[y][x][i] = (y * width + x) % 2049;
            }
        }
}